

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O3

Result * CoreML::validateOptional(Result *__return_storage_ptr__,Model *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint32_t uVar2;
  Rep *pRVar3;
  bool bVar4;
  void **ppvVar5;
  ModelDescription *pMVar6;
  long lVar7;
  long lVar8;
  undefined1 *puVar9;
  Result r;
  size_type __dnew_1;
  size_type __dnew;
  char *local_a0;
  _Alloc_hider local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  string local_78;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  undefined1 local_48 [24];
  size_type local_30;
  
  Result::Result((Result *)&local_a0);
  validateDefaultOptionalValues((Result *)local_58,format);
  local_a0 = (char *)local_58;
  std::__cxx11::string::operator=((string *)&local_98,(string *)&local_50);
  if (local_50._M_p != local_48 + 8) {
    operator_delete(local_50._M_p,local_48._8_8_ + 1);
  }
  bVar4 = Result::good((Result *)&local_a0);
  if (bVar4) {
    uVar2 = format->_oneof_case_[0];
    if ((int)uVar2 < 0x193) {
      if ((int)uVar2 < 0x12e) {
        if (2 < uVar2 - 200) goto LAB_002ed87d;
      }
      else if (uVar2 != 0x12e) {
        if (uVar2 == 0x12f) goto LAB_002ed6c7;
        if (uVar2 != 0x192) goto LAB_002ed87d;
      }
    }
    else if ((int)uVar2 < 0x1f6) {
      if ((uVar2 == 0x193) || (uVar2 == 500)) goto LAB_002ed6c7;
      if (uVar2 != 0x1f5) goto LAB_002ed87d;
    }
    else {
      if ((int)uVar2 < 900) {
        if (uVar2 == 0x1f6) goto LAB_002ed6c7;
        if (uVar2 == 0x259) goto LAB_002ed711;
LAB_002ed87d:
        pMVar6 = format->description_;
        if (pMVar6 == (ModelDescription *)0x0) {
          pMVar6 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
        }
        pRVar3 = (pMVar6->input_).super_RepeatedPtrFieldBase.rep_;
        ppvVar5 = pRVar3->elements;
        if (pRVar3 == (Rep *)0x0) {
          ppvVar5 = (void **)0x0;
        }
        lVar7 = (long)(pMVar6->input_).super_RepeatedPtrFieldBase.current_size_;
        if (lVar7 != 0) {
          lVar8 = 0;
          do {
            puVar9 = *(undefined1 **)(*(long *)((long)ppvVar5 + lVar8) + 0x20);
            if (puVar9 == (undefined1 *)0x0) {
              puVar9 = Specification::_FeatureType_default_instance_;
            }
            if (puVar9[0x10] == '\x01') {
              local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_78,"Features cannot be optional to this type of model.",""
                        );
              Result::Result((Result *)local_58,INVALID_MODEL_PARAMETERS,&local_78);
              goto LAB_002ed9bf;
            }
            lVar8 = lVar8 + 8;
          } while (lVar7 * 8 != lVar8);
        }
        pRVar3 = (pMVar6->output_).super_RepeatedPtrFieldBase.rep_;
        ppvVar5 = pRVar3->elements;
        if (pRVar3 == (Rep *)0x0) {
          ppvVar5 = (void **)0x0;
        }
        lVar7 = (long)(pMVar6->output_).super_RepeatedPtrFieldBase.current_size_;
        if (lVar7 != 0) {
          lVar8 = 0;
LAB_002ed8f7:
          puVar9 = *(undefined1 **)(*(long *)((long)ppvVar5 + lVar8) + 0x20);
          if (puVar9 == (undefined1 *)0x0) {
            puVar9 = Specification::_FeatureType_default_instance_;
          }
          if (puVar9[0x10] != '\x01') goto code_r0x002ed90d;
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          local_30 = 0x1b;
          local_78._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_78,(ulong)&local_30);
          local_78.field_2._M_allocated_capacity = local_30;
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p + 0xb) = 'n';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p + 0xc) = 'o';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p + 0xd) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p + 0xe) = ' ';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p + 0xf) = 'b';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p + 0x10) = 'e';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p + 0x11) = ' ';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p + 0x12) = 'o';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p + 0x13) = 'p';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p + 0x14) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p + 0x15) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p + 0x16) = 'o';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p + 0x17) = 'n';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p + 0x18) = 'a';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p + 0x19) = 'l';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p + 0x1a) = '.';
          *(undefined8 *)local_78._M_dataplus._M_p = 0x207374757074754f;
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p + 8) = 'c';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p + 9) = 'a';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p + 10) = 'n';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p + 0xb) = 'n';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p + 0xc) = 'o';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p + 0xd) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p + 0xe) = ' ';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_78._M_dataplus._M_p + 0xf) = 'b';
          local_78._M_string_length = local_30;
          local_78._M_dataplus._M_p[local_30] = '\0';
          Result::Result((Result *)local_58,INVALID_MODEL_INTERFACE,&local_78);
LAB_002ed9bf:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          goto LAB_002ed6e1;
        }
LAB_002ed916:
        Result::Result((Result *)local_58);
      }
      else {
        if (uVar2 == 900) goto LAB_002ed711;
        if (uVar2 != 3000) goto LAB_002ed87d;
LAB_002ed6c7:
        pMVar6 = format->description_;
        if (pMVar6 == (ModelDescription *)0x0) {
          pMVar6 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
        }
        validateOptionalNN((Result *)local_58,pMVar6);
      }
LAB_002ed6e1:
      local_a0 = (char *)local_58;
      std::__cxx11::string::operator=((string *)&local_98,(string *)&local_50);
      if (local_50._M_p != local_48 + 8) {
        operator_delete(local_50._M_p,local_48._8_8_ + 1);
      }
    }
LAB_002ed711:
    bVar4 = Result::good((Result *)&local_a0);
    if (bVar4) {
      pMVar6 = format->description_;
      if (pMVar6 == (ModelDescription *)0x0) {
        pMVar6 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
      }
      pRVar3 = (pMVar6->output_).super_RepeatedPtrFieldBase.rep_;
      ppvVar5 = pRVar3->elements;
      if (pRVar3 == (Rep *)0x0) {
        ppvVar5 = (void **)0x0;
      }
      lVar7 = (long)(pMVar6->output_).super_RepeatedPtrFieldBase.current_size_;
      if (lVar7 != 0) {
        lVar8 = 0;
        do {
          puVar9 = *(undefined1 **)(*(long *)((long)ppvVar5 + lVar8) + 0x20);
          if (puVar9 == (undefined1 *)0x0) {
            puVar9 = Specification::_FeatureType_default_instance_;
          }
          if (puVar9[0x10] == '\x01') {
            local_78._M_dataplus._M_p = (pointer)0x1b;
            local_58 = (undefined1  [8])local_48;
            local_58 = (undefined1  [8])
                       std::__cxx11::string::_M_create((ulong *)local_58,(ulong)&local_78);
            local_48._0_8_ = local_78._M_dataplus._M_p;
            builtin_strncpy((char *)local_58,"Outputs cannot be optional.",0x1b);
            local_50._M_p = local_78._M_dataplus._M_p;
            *(char *)((long)local_58 + (long)local_78._M_dataplus._M_p) = '\0';
            Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_58);
            if (local_58 != (undefined1  [8])local_48) {
              operator_delete((void *)local_58,(ulong)(local_48._0_8_ + 1));
            }
            goto LAB_002ed7cf;
          }
          lVar8 = lVar8 + 8;
        } while (lVar7 * 8 != lVar8);
      }
      Result::Result(__return_storage_ptr__);
      goto LAB_002ed7cf;
    }
  }
  *(char **)__return_storage_ptr__ = local_a0;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_p == &local_88) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_88._M_allocated_capacity._1_7_,local_88._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_88._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_98._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_88._M_allocated_capacity._1_7_,local_88._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_90;
  local_90 = 0;
  local_88._M_local_buf[0] = '\0';
  local_98._M_p = (pointer)&local_88;
LAB_002ed7cf:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_p != &local_88) {
    operator_delete(local_98._M_p,
                    CONCAT71(local_88._M_allocated_capacity._1_7_,local_88._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
code_r0x002ed90d:
  lVar8 = lVar8 + 8;
  if (lVar7 * 8 == lVar8) goto LAB_002ed916;
  goto LAB_002ed8f7;
}

Assistant:

Result validateOptional(const Specification::Model& format) {
        Result r;
        r = validateDefaultOptionalValues(format);

        if (!r.good()) {
            return r;
        }

        switch (format.Type_case()) {
            case Specification::Model::kImputer:
                // Imputed values can be handled by replacing a particular value, so
                // optional is not required.
                break;
            case Specification::Model::kNeuralNetwork:
            case Specification::Model::kNeuralNetworkRegressor:
            case Specification::Model::kNeuralNetworkClassifier:
            case Specification::Model::kSerializedModel:
            case Specification::Model::kMlProgram:
                r = validateOptionalNN(format.description());
                break;
            case Specification::Model::kTreeEnsembleRegressor:
            case Specification::Model::kTreeEnsembleClassifier:
                // allow arbitrary optional in tree inputs, just check outputs
                break;
            case Specification::Model::kPipeline:
            case Specification::Model::kPipelineRegressor:
            case Specification::Model::kPipelineClassifier:
                // pipeline has valid optional inputs iff the models inside are valid.
                // this should be guaranteed by the pipeline validator.
                break;
            case Specification::Model::kItemSimilarityRecommender:
                // allow arbitrary optional in the recommender.  The recommender valiadator catches these.
                break;
            case Specification::Model::kIdentity:
                // anything goes for the identity function
                break;
            default:
                r = validateOptionalGeneric(format.description());
        }
        if (!r.good()) {
            return r;
        }

        return validateOptionalOutputs(format.description());
    }